

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O2

ostream * cnn::operator<<(ostream *os,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *ds)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  
  std::operator<<(os,'[');
  for (uVar1 = 0; uVar3 = (ulong)uVar1,
      uVar3 < (ulong)(((long)(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x24); uVar1 = uVar1 + 1) {
    pcVar4 = " ";
    if (uVar3 == 0) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(os,pcVar4);
    operator<<(poVar2,(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar3);
  }
  poVar2 = std::operator<<(os,']');
  return poVar2;
}

Assistant:

ostream& operator<<(ostream& os, const vector<Dim>& ds) {
  os << '[';
  for (unsigned i = 0; i < ds.size(); ++i)
    os << (i ? " " : "") << ds[i];
  return os << ']';
}